

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O2

void __thiscall
embree::sse2::collision_regression_test::collision_regression_test
          (collision_regression_test *this,char *name)

{
  RegressionTest *in_stack_ffffffffffffffc8;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,(allocator *)&stack0xffffffffffffffcf);
  RegressionTest::RegressionTest(&this->super_RegressionTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_021da6f0;
  registerRegressionTest(in_stack_ffffffffffffffc8);
  return;
}

Assistant:

collision_regression_test(const char* name) : RegressionTest(name) {
        registerRegressionTest(this);
      }